

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_helper.c
# Opt level: O1

void helper_store_dpdes(CPUPPCState_conflict2 *env,target_ulong val)

{
  char *in_RDX;
  
  helper_hfscr_facility_check_ppc64(env,0x400,in_RDX,10);
  if (val < 2) {
    if (val != 0) {
      env->pending_interrupts = env->pending_interrupts | 0x4000;
      (*cpu_interrupt_handler)((CPUState *)&env[-1].spr_cb[0x1bf].oea_write,2);
      return;
    }
    env->pending_interrupts = env->pending_interrupts & 0xffffbfff;
  }
  return;
}

Assistant:

void helper_store_dpdes(CPUPPCState *env, target_ulong val)
{
    PowerPCCPU *cpu = env_archcpu(env);
    CPUState *cs = CPU(cpu);

    helper_hfscr_facility_check(env, HFSCR_MSGP, "store DPDES", HFSCR_IC_MSGP);

    /* TODO: TCG supports only one thread */
    if (val & ~0x1) {
        qemu_log_mask(LOG_GUEST_ERROR, "Invalid DPDES register value "
                      TARGET_FMT_lx"\n", val);
        return;
    }

    if (val & 0x1) {
        env->pending_interrupts |= 1 << PPC_INTERRUPT_DOORBELL;
        cpu_interrupt(cs, CPU_INTERRUPT_HARD);
    } else {
        env->pending_interrupts &= ~(1 << PPC_INTERRUPT_DOORBELL);
    }
}